

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O2

bool labelling::operator==(Label *label1,Label *label2)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  long lVar5;
  
  if ((label1->vertex).lemon_id != (label2->vertex).lemon_id) {
    return false;
  }
  if (((label1->weight != label2->weight) || (NAN(label1->weight) || NAN(label2->weight))) ||
     (bVar4 = std::operator==(&label1->partial_path,&label2->partial_path), !bVar4)) {
    bVar4 = false;
  }
  else {
    pdVar3 = (label1->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    while (bVar4 = (long)(label1->resource_consumption).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar3 >> 3 == lVar5, !bVar4) {
      dVar2 = pdVar3[lVar5];
      pdVar1 = (label2->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar5;
      lVar5 = lVar5 + 1;
      if (dVar2 != *pdVar1) {
        return bVar4;
      }
      if (NAN(dVar2) || NAN(*pdVar1)) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

bool operator==(const Label& label1, const Label& label2) {
  if (label1.vertex.lemon_id != label2.vertex.lemon_id)
    return false;
  if (label1.weight != label2.weight)
    return false;
  if (label1.partial_path != label2.partial_path)
    return false;
  /// Check every resource for inequality
  for (int i = 0; i < label1.resource_consumption.size(); i++) {
    if (label1.resource_consumption[i] != label2.resource_consumption[i]) {
      return false;
    }
  }
  return true;
}